

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O3

void __thiscall VSpanData::setupMatrix(VSpanData *this,VMatrix *matrix)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  MatrixType MVar6;
  bool bVar7;
  int iVar8;
  undefined7 extraout_var;
  bool bVar9;
  float fVar10;
  float fVar11;
  VMatrix inv;
  VMatrix local_48;
  
  bVar9 = false;
  VMatrix::inverted(&local_48,matrix,(bool *)0x0);
  this->m11 = local_48.m11;
  this->m12 = local_48.m12;
  this->m13 = local_48.m13;
  this->m21 = local_48.m21;
  this->m22 = local_48.m22;
  this->m23 = local_48.m23;
  this->m33 = local_48.m33;
  this->dx = local_48.mtx;
  this->dy = local_48.mty;
  MVar6 = VMatrix::type(&local_48);
  this->transformType = MVar6;
  bVar7 = VMatrix::isAffine(&local_48);
  if (bVar7) {
    uVar1 = this->m11;
    uVar3 = this->m12;
    uVar2 = this->m21;
    uVar4 = this->m22;
    fVar10 = (float)uVar1 * (float)uVar1 + (float)uVar2 * (float)uVar2;
    fVar11 = (float)uVar3 * (float)uVar3 + (float)uVar4 * (float)uVar4;
    auVar5._4_4_ = -(uint)(1.5258789e-05 < fVar11);
    auVar5._0_4_ = -(uint)(1.5258789e-05 < fVar10);
    auVar5._8_4_ = -(uint)(fVar10 < 10000.0);
    auVar5._12_4_ = -(uint)(fVar11 < 10000.0);
    iVar8 = movmskps((int)CONCAT71(extraout_var,bVar7),auVar5);
    if ((iVar8 != 0xf) || (10000.0 <= ABS(this->dx))) {
      bVar9 = false;
    }
    else {
      bVar9 = ABS(this->dy) < 10000.0;
    }
  }
  this->fast_matrix = bVar9;
  return;
}

Assistant:

void VSpanData::setupMatrix(const VMatrix &matrix)
{
    VMatrix inv = matrix.inverted();
    m11 = inv.m11;
    m12 = inv.m12;
    m13 = inv.m13;
    m21 = inv.m21;
    m22 = inv.m22;
    m23 = inv.m23;
    m33 = inv.m33;
    dx = inv.mtx;
    dy = inv.mty;
    transformType = inv.type();

    const bool  affine = inv.isAffine();
    const float f1 = m11 * m11 + m21 * m21;
    const float f2 = m12 * m12 + m22 * m22;
    fast_matrix = affine && f1 < 1e4 && f2 < 1e4 && f1 > (1.0 / 65536) &&
                  f2 > (1.0 / 65536) && fabs(dx) < 1e4 && fabs(dy) < 1e4;
}